

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall CTcGenTarg::build_intrinsic_class_objs(CTcGenTarg *this,CTcDataStream *str)

{
  CTcSymObj *pCVar1;
  ulong val;
  tc_meta_entry *ptVar2;
  uint val_00;
  
  ptVar2 = (tc_meta_entry *)&this->meta_head_;
  val_00 = 0;
  while (ptVar2 = ptVar2->nxt, ptVar2 != (tc_meta_entry *)0x0) {
    if (ptVar2->sym != (CTcSymMetaclass *)0x0) {
      CTcDataStream::write4(str,(ulong)(ptVar2->sym->super_CTcSymMetaclassBase).class_obj_);
      CTcDataStream::write2(str,8);
      CTcDataStream::write2(str,8);
      CTcDataStream::write2(str,val_00);
      pCVar1 = (ptVar2->sym->super_CTcSymMetaclassBase).mod_obj_;
      if (pCVar1 == (CTcSymObj *)0x0) {
        val = 0;
      }
      else {
        val = (pCVar1->super_CTcSymObjBase).obj_id_;
      }
      CTcDataStream::write4(str,val);
      CTcSymMetaclass::fix_mod_obj_sc_list(ptVar2->sym);
    }
    val_00 = val_00 + 1;
  }
  return;
}

Assistant:

void CTcGenTarg::build_intrinsic_class_objs(CTcDataStream *str)
{
    tc_meta_entry *meta;
    uint idx;
    
    /* 
     *   run through the dependency table, and create an IntrinsicClass
     *   object for each entry 
     */
    for (idx = 0, meta = meta_head_ ; meta != 0 ; meta = meta->nxt, ++idx)
    {
        /* 
         *   if we have a symbol for this class, add the object to the
         *   intrinsic class stream 
         */
        if (meta->sym != 0)
        {
            /* write the OBJS header */
            str->write4(meta->sym->get_class_obj());
            str->write2(8);

            /* 
             *   write the data - the data length (8), followed by the
             *   intrinsic class index that this object is associated
             *   with, followed by the modifier object
             */
            str->write2(8);
            str->write2(idx);
            str->write4(meta->sym->get_mod_obj() == 0
                        ? VM_INVALID_OBJ
                        : meta->sym->get_mod_obj()->get_obj_id());

            /* 
             *   fix up the inheritance chain in the modifier objects, if
             *   necessary 
             */
            meta->sym->fix_mod_obj_sc_list();
        }
    }
}